

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

led * __thiscall ev3dev::led::set_delay_on(led *this,int v)

{
  led *in_RDI;
  device *in_stack_00000070;
  led *in_stack_ffffffffffffff88;
  led *this_00;
  allocator local_39;
  string local_38 [56];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"delay_on",&local_39);
  device::set_attr_int(in_stack_00000070,(string *)this,v);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  led(this_00,in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

led set_delay_on(int v) {
            set_attr_int("delay_on", v);
            return *this;
        }